

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaC_linkupval(lua_State *L,UpVal *uv)

{
  global_State *pgVar1;
  GCObject *o;
  global_State *g;
  UpVal *uv_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  uv->next = pgVar1->rootgc;
  pgVar1->rootgc = (GCObject *)uv;
  if (((uv->marked & 4) == 0) && ((uv->marked & 3) == 0)) {
    if (pgVar1->gcstate == '\x01') {
      uv->marked = uv->marked | 4;
      if (((3 < uv->v->tt) && (((((uv->v->value).gc)->gch).marked & 3) != 0)) &&
         ((uv->marked & 4) != 0)) {
        luaC_barrierf(L,(GCObject *)uv,(uv->v->value).gc);
      }
    }
    else {
      uv->marked = uv->marked & 0xf8 | pgVar1->currentwhite & 3;
    }
  }
  return;
}

Assistant:

static void luaC_linkupval(lua_State*L,UpVal*uv){
global_State*g=G(L);
GCObject*o=obj2gco(uv);
o->gch.next=g->rootgc;
g->rootgc=o;
if(isgray(o)){
if(g->gcstate==1){
gray2black(o);
luaC_barrier(L,uv,uv->v);
}
else{
makewhite(g,o);
}
}
}